

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.hpp
# Opt level: O0

void __thiscall WalkerManager::UpdateAllWalkers(WalkerManager *this)

{
  bool bVar1;
  iterator iter;
  vector<std::shared_ptr<MWakler>,_std::allocator<std::shared_ptr<MWakler>_>_>
  *in_stack_ffffffffffffff98;
  shared_ptr<MWakler> *in_stack_ffffffffffffffa0;
  float in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffbc;
  shared_ptr<MWakler> *in_stack_ffffffffffffffc0;
  vector<std::shared_ptr<MWakler>,_std::allocator<std::shared_ptr<MWakler>_>_> local_28;
  shared_ptr<MWakler> local_10;
  
  local_10.super___shared_ptr<MWakler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       std::vector<std::shared_ptr<MWakler>,_std::allocator<std::shared_ptr<MWakler>_>_>::begin
                 (in_stack_ffffffffffffff98);
  while( true ) {
    local_28.
    super__Vector_base<std::shared_ptr<MWakler>,_std::allocator<std::shared_ptr<MWakler>_>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage =
         (pointer)std::vector<std::shared_ptr<MWakler>,_std::allocator<std::shared_ptr<MWakler>_>_>
                  ::end(in_stack_ffffffffffffff98);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<MWakler>_*,_std::vector<std::shared_ptr<MWakler>,_std::allocator<std::shared_ptr<MWakler>_>_>_>
                        *)in_stack_ffffffffffffffa0,
                       (__normal_iterator<std::shared_ptr<MWakler>_*,_std::vector<std::shared_ptr<MWakler>,_std::allocator<std::shared_ptr<MWakler>_>_>_>
                        *)in_stack_ffffffffffffff98);
    if (!bVar1) break;
    in_stack_ffffffffffffffa0 = &local_10;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<MWakler>_*,_std::vector<std::shared_ptr<MWakler>,_std::allocator<std::shared_ptr<MWakler>_>_>_>
    ::operator*((__normal_iterator<std::shared_ptr<MWakler>_*,_std::vector<std::shared_ptr<MWakler>,_std::allocator<std::shared_ptr<MWakler>_>_>_>
                 *)in_stack_ffffffffffffffa0);
    in_stack_ffffffffffffff98 = &local_28;
    std::shared_ptr<MWakler>::shared_ptr
              (in_stack_ffffffffffffffa0,(shared_ptr<MWakler> *)in_stack_ffffffffffffff98);
    UpdateRandSpeed(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
    std::shared_ptr<MWakler>::~shared_ptr((shared_ptr<MWakler> *)0x12a421);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<MWakler>_*,_std::vector<std::shared_ptr<MWakler>,_std::allocator<std::shared_ptr<MWakler>_>_>_>
    ::operator*((__normal_iterator<std::shared_ptr<MWakler>_*,_std::vector<std::shared_ptr<MWakler>,_std::allocator<std::shared_ptr<MWakler>_>_>_>
                 *)in_stack_ffffffffffffffa0);
    std::shared_ptr<MWakler>::shared_ptr
              (in_stack_ffffffffffffffa0,(shared_ptr<MWakler> *)in_stack_ffffffffffffff98);
    RandWalk(in_stack_ffffffffffffffc0);
    std::shared_ptr<MWakler>::~shared_ptr((shared_ptr<MWakler> *)0x12a453);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<MWakler>_*,_std::vector<std::shared_ptr<MWakler>,_std::allocator<std::shared_ptr<MWakler>_>_>_>
    ::operator++((__normal_iterator<std::shared_ptr<MWakler>_*,_std::vector<std::shared_ptr<MWakler>,_std::allocator<std::shared_ptr<MWakler>_>_>_>
                  *)&local_10);
  }
  return;
}

Assistant:

void UpdateAllWalkers()
    {
        for(auto iter=walkers.begin(); iter != walkers.end(); ++iter)
        {
            UpdateRandSpeed(*iter);
            RandWalk(*iter);
        }
    }